

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

bool __thiscall
Js::FunctionExecutionStateMachine::TryTransitionToNextExecutionMode
          (FunctionExecutionStateMachine *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar4;
  uint16 *limit;
  FunctionEntryPointInfo *pFVar5;
  Type state;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x21c,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
LAB_006e5586:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (this->executionState != FullJit) {
    limit = GetStateLimit(this,this->executionState);
    pFVar5 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
    if (((this->executionState == SimpleJit) || ((uint)*limit <= this->interpretedCount)) &&
       ((pFVar5 == (FunctionEntryPointInfo *)0x0 || (pFVar5->callsCount == 0)))) {
      CommitExecutedIterations(this,limit,(uint)*limit);
      this->interpretedCount = 0;
      state = this->executionState;
      bVar2 = true;
LAB_006e54a2:
      if (bVar2) {
        bVar2 = IsTerminalState(this,state);
        if (!bVar2) {
          bVar2 = state == Interpreter;
          state = state + AutoProfilingInterpreter0;
          if (bVar2) {
            state = FullJit;
          }
          if (state == FullJit) goto code_r0x006e54d4;
          goto LAB_006e54ff;
        }
        bVar2 = IsTerminalState(this,state);
        if (bVar2) {
          if (state == this->executionState) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                        ,0x25e,"(newState != executionState)",
                                        "newState != executionState");
            if (!bVar2) goto LAB_006e5586;
            *puVar4 = 0;
          }
          SetExecutionState(this,state);
          return true;
        }
      }
    }
  }
  return false;
code_r0x006e54d4:
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)(this->owner).ptr);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->owner).ptr);
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01441eb0,FullJitPhase,sourceContextId,functionId);
  bVar2 = false;
  if (!bVar3) {
LAB_006e54ff:
    bVar2 = true;
  }
  goto LAB_006e54a2;
}

Assistant:

bool FunctionExecutionStateMachine::TryTransitionToNextExecutionMode()
    {
        Assert(initializedExecutionModeAndLimits);

        bool isStateChanged = false;
        if (executionState != ExecutionState::FullJit)
        {
            bool isTransitionNeeded;
            uint16& stateLimit = GetStateLimit(executionState);
            FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();

            // Determine if the current state should not transition when
            // - for non-JITed states, the interpreted count is less than the limit
            // - for JITed states (specifically, SimpleJIT because it can transition), the callsCount
            //   is non-zero. CallsCount starts at the limit and decrements to 0 to indicate transition.
            if ((executionState != ExecutionState::SimpleJit && GetInterpretedCount() < stateLimit)
                || (simpleJitEntryPointInfo != nullptr && simpleJitEntryPointInfo->callsCount > 0))
            {
                // Since the current state is under its limit, no transition is needed.
                // Simply verify the current state's execution mode before returning.
                isTransitionNeeded = false;
            }
            else
            {
                // Since the current state's limit is reached, transition from this state to the next state
                // First, save data from the current state
                CommitExecutedIterations(stateLimit, stateLimit);

                // Then, reset data for the next state
                SetInterpretedCount(0);

                isTransitionNeeded = true;
            }

            if (isTransitionNeeded)
            {
                // Keep advancing the state until a terminal state is found or until there are no more 
                // states to reach. The path of advancement is described in the banner comment above.
                ExecutionState newState = executionState;
                while (isTransitionNeeded && !IsTerminalState(newState))
                {
                    if (newState != ExecutionState::Interpreter)
                    {
                        // Most states simply advance to the next state
                        newState = static_cast<ExecutionState>(static_cast<uint8>(newState) + 1);
                    }
                    else
                    {
                        // Interpreter advances straight to FullJit
                        newState = ExecutionState::FullJit;
                    }

                    // If FullJit is the next state, but FullJit is disabled, then no transition
                    // is needed.
                    if (newState == ExecutionState::FullJit && PHASE_OFF(FullJitPhase, owner))
                    {
                        isTransitionNeeded = false;
                    }
                    else
                    {
                        // Otherwise, transition is needed because there is new state available
                        isTransitionNeeded = true;
                    }
                }

                // Only update the execution state when the new state is a terminal state
                if (isTransitionNeeded && IsTerminalState(newState))
                {
                    Assert(newState != executionState);
                    SetExecutionState(newState);
                    isStateChanged = true;
                }
            }
        }

        return isStateChanged;
    }